

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  uint *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar9;
  bool bVar10;
  float in_XMM0_Da;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImVec2 IVar17;
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  uint v_new_off_round;
  uint v_new_off_floor;
  float v_new_off_f;
  float a_1;
  float a;
  uint v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_f4;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  int iVar18;
  bool local_d5;
  ImVec2 local_d4;
  ImVec2 local_cc;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  ImGuiDataType in_stack_ffffffffffffff50;
  ImVec2 local_ac;
  float local_a4;
  float in_stack_ffffffffffffff60;
  ImGuiDataType in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float local_80;
  float local_7c;
  float fStack_78;
  float local_70;
  bool local_69;
  float local_60;
  float local_4c;
  
  pIVar3 = GImGui;
  uVar5 = (uint)((in_stack_00000010 & 1) != 0);
  bVar9 = in_EDX == 8;
  bVar10 = in_EDX == 9;
  local_d5 = bVar9 || bVar10;
  if ((in_XMM0_Da == 1.0) && (!NAN(in_XMM0_Da))) {
    local_d5 = false;
  }
  fVar11 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar5);
  fVar12 = ImVec2::operator[](in_RDI,(long)(int)uVar5);
  fVar12 = (fVar11 - fVar12) - 4.0;
  local_4c = (pIVar3->Style).GrabMinSize;
  if (in_R8D < in_R9D) {
    iVar6 = in_R9D - in_R8D;
  }
  else {
    iVar6 = in_R8D - in_R9D;
  }
  local_7c = in_stack_ffffffffffffff10;
  iVar18 = iVar6;
  if ((!bVar9 && !bVar10) && (-1 < iVar6)) {
    local_4c = ImMax<float>(fVar12 / (float)(iVar6 + 1),(pIVar3->Style).GrabMinSize);
    local_7c = in_stack_ffffffffffffff10;
  }
  fVar13 = ImMin<float>(local_4c,fVar12);
  fVar14 = ImVec2::operator[](in_RDI,(long)(int)uVar5);
  fVar14 = fVar13 * 0.5 + fVar14 + 2.0;
  fVar15 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar5);
  if ((!local_d5) || (0.0 <= (float)(in_R8D * in_R9D))) {
    local_60 = (float)(-(uint)((float)in_R8D < 0.0) & 0x3f800000);
  }
  else {
    in_stack_ffffffffffffff1c = (float)in_R8D;
    local_60 = ImPow(0.0,3.178627e-39);
    in_stack_ffffffffffffff18 = (float)in_R9D;
    fVar16 = ImPow(0.0,3.178764e-39);
    local_60 = local_60 / (local_60 + fVar16);
  }
  local_69 = false;
  if (pIVar3->ActiveId == in_ESI) {
    bVar4 = false;
    local_70 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar3->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar8 = ImVec2::operator[](&(pIVar3->IO).MousePos,(long)(int)uVar5);
        if (fVar12 - fVar13 <= 0.0) {
          in_stack_ffffffffffffff14 = 0.0;
        }
        else {
          in_stack_ffffffffffffff14 = ImClamp<float>((*pfVar8 - fVar14) / (fVar12 - fVar13),0.0,1.0)
          ;
        }
        local_70 = in_stack_ffffffffffffff14;
        if (uVar5 == 1) {
          local_70 = 1.0 - in_stack_ffffffffffffff14;
        }
        bVar4 = true;
      }
    }
    else if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar17 = GetNavInputAmount2d(in_stack_ffffffffffffff4c,
                                   (ImGuiInputReadMode)in_stack_ffffffffffffff48,
                                   in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
      if (uVar5 == 0) {
        local_7c = IVar17.x;
      }
      else {
        fStack_78 = IVar17.y;
        local_7c = -fStack_78;
      }
      if ((pIVar3->NavActivatePressedId == in_ESI) && ((pIVar3->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_7c != 0.0) || (NAN(local_7c))) {
        fVar16 = local_7c;
        local_70 = SliderCalcRatioFromValueT<unsigned_int,float>
                             (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                              (uint)in_stack_ffffffffffffff48,(uint)in_stack_ffffffffffffff44,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        if (bVar9 || bVar10) {
          local_f4 = ImParseFormatPrecision
                               ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18
                                                ),(int)in_stack_ffffffffffffff14);
        }
        else {
          local_f4 = 0;
        }
        if ((0 < local_f4) || (local_d5)) {
          local_80 = local_7c / 100.0;
          bVar4 = IsNavInputDown(0xe);
          if (bVar4) {
            local_80 = local_80 / 10.0;
          }
        }
        else if (((-100.0 <= (float)iVar6) && ((float)iVar6 <= 100.0)) ||
                (bVar4 = IsNavInputDown(0xe), bVar4)) {
          local_80 = (float)(~-(uint)(local_7c < 0.0) & 0x3f800000 |
                            -(uint)(local_7c < 0.0) & 0xbf800000) / (float)iVar6;
        }
        else {
          local_80 = local_7c / 100.0;
        }
        bVar4 = IsNavInputDown(0xf);
        if (bVar4) {
          local_80 = local_80 * 10.0;
        }
        bVar4 = true;
        if (((1.0 <= local_70) && (0.0 < local_80)) || ((local_70 <= 0.0 && (local_80 < 0.0)))) {
          bVar4 = false;
          local_7c = fVar16;
        }
        else {
          local_70 = ImSaturate(local_70 + local_80);
          local_7c = fVar16;
        }
      }
    }
    if (bVar4) {
      if (local_d5) {
        if (local_60 <= local_70) {
          ImFabs(local_60 - 1.0);
          fVar16 = ImPow(0.0,3.180655e-39);
          uVar7 = ImMax<unsigned_int>(in_R8D,0);
          ImLerp<unsigned_int>(uVar7,in_R9D,fVar16);
        }
        else {
          fVar16 = ImPow(0.0,3.180416e-39);
          uVar7 = ImMin<unsigned_int>(in_R9D,0);
          ImLerp<unsigned_int>(uVar7,in_R8D,fVar16);
        }
      }
      else if (bVar9 || bVar10) {
        ImLerp<unsigned_int>(in_R8D,in_R9D,local_70);
      }
      else {
        in_stack_ffffffffffffff6c = (float)(in_R9D - in_R8D) * local_70;
        in_stack_ffffffffffffff68 = (undefined4)(long)in_stack_ffffffffffffff6c;
        in_stack_ffffffffffffff64 = (ImGuiDataType)(long)(in_stack_ffffffffffffff6c + 0.5);
      }
      uVar7 = RoundScalarWithFormatT<unsigned_int,int>
                        ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         in_stack_ffffffffffffff64,(uint)in_stack_ffffffffffffff60);
      local_69 = *in_RCX != uVar7;
      if (local_69) {
        *in_RCX = uVar7;
      }
    }
  }
  if (1.0 <= fVar12) {
    fVar12 = SliderCalcRatioFromValueT<unsigned_int,float>
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                        (uint)in_stack_ffffffffffffff48,(uint)in_stack_ffffffffffffff44,
                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    if (uVar5 == 1) {
      fVar12 = 1.0 - fVar12;
    }
    ImLerp<float>(fVar14,-fVar13 * 0.5 + (fVar15 - 2.0),fVar12);
    if (uVar5 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(fVar11,iVar18),in_stack_ffffffffffffff1c,
                     in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,local_7c);
      IVar17.y = in_stack_ffffffffffffff40;
      IVar17.x = in_stack_ffffffffffffff3c;
      *in_stack_00000018 = IVar17;
      IVar1.y = in_stack_ffffffffffffff48;
      IVar1.x = in_stack_ffffffffffffff44;
      in_stack_00000018[1] = IVar1;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(fVar11,iVar18),in_stack_ffffffffffffff1c,
                     in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,local_7c);
      *in_stack_00000018 = local_d4;
      in_stack_00000018[1] = local_cc;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_ac,in_RDI,in_RDI);
    *in_stack_00000018 = local_ac;
    IVar2.y = in_stack_ffffffffffffff60;
    IVar2.x = local_a4;
    in_stack_00000018[1] = IVar2;
  }
  return local_69;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}